

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_scan_block_scalar_breaks
              (yaml_parser_t *parser,int *indent,yaml_string_t *breaks,yaml_mark_t start_mark,
              yaml_mark_t *end_mark)

{
  yaml_char_t **pointer;
  size_t *psVar1;
  yaml_char_t **ppyVar2;
  yaml_char_t yVar3;
  yaml_char_t *pyVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  byte *pbVar8;
  yaml_char_t *pyVar9;
  size_t sVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  long lStack_60;
  
  end_mark->column = (parser->mark).column;
  sVar10 = (parser->mark).line;
  end_mark->index = (parser->mark).index;
  end_mark->line = sVar10;
  pointer = &breaks->pointer;
  iVar14 = 0;
  do {
    sVar10 = parser->unread;
    while( true ) {
      if ((sVar10 == 0) && (iVar7 = yaml_parser_update_buffer(parser,1), iVar7 == 0)) {
        return 0;
      }
      iVar7 = *indent;
      if (iVar7 == 0) {
        pbVar8 = (parser->buffer).pointer;
      }
      else {
        iVar13 = (int)(parser->mark).column;
        pbVar8 = (parser->buffer).pointer;
        if (iVar7 <= iVar13) {
          if (iVar14 <= iVar13) {
            iVar14 = iVar13;
          }
          goto LAB_0010c1bf;
        }
      }
      bVar12 = *pbVar8;
      if (bVar12 != 0x20) break;
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      sVar10 = parser->unread - 1;
      parser->unread = sVar10;
      bVar12 = *pbVar8;
      lVar11 = 1;
      if ((((char)bVar12 < '\0') && (lVar11 = 2, (bVar12 & 0xe0) != 0xc0)) &&
         (lVar11 = 3, (bVar12 & 0xf0) != 0xe0)) {
        lVar11 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar8 + lVar11;
    }
    iVar13 = (int)(parser->mark).column;
    if (iVar14 <= iVar13) {
      iVar14 = iVar13;
    }
    if (iVar7 == 0) {
      bVar6 = true;
LAB_0010c1c7:
      bVar5 = bVar6;
      if (bVar12 == 9) {
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a block scalar";
        (parser->context_mark).index = start_mark.index;
        (parser->context_mark).line = start_mark.line;
        (parser->context_mark).column = start_mark.column;
        parser->problem = "found a tab character where an indentation space is expected";
        sVar10 = (parser->mark).line;
        (parser->problem_mark).index = (parser->mark).index;
        (parser->problem_mark).line = sVar10;
        (parser->problem_mark).column = (parser->mark).column;
        return 0;
      }
    }
    else {
LAB_0010c1bf:
      bVar5 = false;
      bVar12 = *pbVar8;
      bVar6 = false;
      if (iVar13 < iVar7) goto LAB_0010c1c7;
    }
    if (((bVar12 != 10) && (bVar12 != 0xd)) &&
       ((bVar12 == 0xe2 || ((bVar12 != 0xc2 || (pbVar8[1] != 0x85)))))) {
      if (!bVar5) {
        return 1;
      }
      *indent = iVar14;
      iVar7 = parser->indent;
      iVar13 = iVar7 + 1;
      if (iVar7 < iVar14) {
        iVar13 = iVar14;
      }
      if (iVar14 <= iVar7 || iVar13 < 1) {
        if (iVar13 < 2) {
          iVar13 = 1;
        }
        *indent = iVar13;
        return 1;
      }
      return 1;
    }
    if ((parser->unread < 2) && (iVar7 = yaml_parser_update_buffer(parser,2), iVar7 == 0)) {
      return 0;
    }
    if ((breaks->end <= *pointer + 5) &&
       (iVar7 = yaml_string_extend(&breaks->start,pointer,&breaks->end), iVar7 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar4 = (parser->buffer).pointer;
    yVar3 = *pyVar4;
    if (yVar3 != 0xe2) {
      if (yVar3 == '\r') {
        pyVar9 = *pointer;
        if (pyVar4[1] == '\n') {
          *pointer = pyVar9 + 1;
          *pyVar9 = '\n';
          ppyVar2 = &(parser->buffer).pointer;
          *ppyVar2 = *ppyVar2 + 2;
          lStack_60 = -2;
          lVar11 = 2;
        }
        else {
LAB_0010c2b5:
          *pointer = pyVar9 + 1;
          *pyVar9 = '\n';
          ppyVar2 = &(parser->buffer).pointer;
          *ppyVar2 = *ppyVar2 + 1;
LAB_0010c368:
          lStack_60 = -1;
          lVar11 = 1;
        }
        (parser->mark).column = 0;
        (parser->mark).index = lVar11 + (parser->mark).index;
        (parser->mark).line = (parser->mark).line + 1;
        parser->unread = parser->unread + lStack_60;
      }
      else if (yVar3 == 0xc2) {
        if (pyVar4[1] == 0x85) {
          pyVar4 = *pointer;
          *pointer = pyVar4 + 1;
          *pyVar4 = '\n';
          ppyVar2 = &(parser->buffer).pointer;
          *ppyVar2 = *ppyVar2 + 2;
          goto LAB_0010c368;
        }
      }
      else if (yVar3 == '\n') {
        pyVar9 = *pointer;
        goto LAB_0010c2b5;
      }
    }
    end_mark->column = (parser->mark).column;
    sVar10 = (parser->mark).line;
    end_mark->index = (parser->mark).index;
    end_mark->line = sVar10;
  } while( true );
}

Assistant:

static int
yaml_parser_scan_block_scalar_breaks(yaml_parser_t *parser,
        int *indent, yaml_string_t *breaks,
        yaml_mark_t start_mark, yaml_mark_t *end_mark)
{
    int max_indent = 0;

    *end_mark = parser->mark;

    /* Eat the indentation spaces and line breaks. */

    while (1)
    {
        /* Eat the indentation spaces. */

        if (!CACHE(parser, 1)) return 0;

        while ((!*indent || (int)parser->mark.column < *indent)
                && IS_SPACE(parser->buffer)) {
            SKIP(parser);
            if (!CACHE(parser, 1)) return 0;
        }

        if ((int)parser->mark.column > max_indent)
            max_indent = (int)parser->mark.column;

        /* Check for a tab character messing the indentation. */

        if ((!*indent || (int)parser->mark.column < *indent)
                && IS_TAB(parser->buffer)) {
            return yaml_parser_set_scanner_error(parser, "while scanning a block scalar",
                    start_mark, "found a tab character where an indentation space is expected");
        }

        /* Have we found a non-empty line? */

        if (!IS_BREAK(parser->buffer)) break;

        /* Consume the line break. */

        if (!CACHE(parser, 2)) return 0;
        if (!READ_LINE(parser, *breaks)) return 0;
        *end_mark = parser->mark;
    }

    /* Determine the indentation level if needed. */

    if (!*indent) {
        *indent = max_indent;
        if (*indent < parser->indent + 1)
            *indent = parser->indent + 1;
        if (*indent < 1)
            *indent = 1;
    }

   return 1;
}